

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O1

void __thiscall agge::tests::RoundedRectangleTests::AllowsIteration(RoundedRectangleTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  FailedAssertion *pFVar4;
  uint uVar5;
  real_t y;
  real_t x;
  rounded_rectangle r;
  real_t rStack_e8;
  real_t local_e4;
  string local_e0;
  LocationInfo local_c0;
  string local_98;
  rounded_rectangle local_74;
  
  rounded_rectangle::rounded_rectangle(&local_74,10.0,20.0,30.0,40.0,5.0,0.0);
  iVar3 = rounded_rectangle::vertex(&local_74,&local_e4,&rStack_e8);
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_c0,&local_e0,0xab);
  if (iVar3 != 1) {
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar4,&local_98,&local_c0);
    __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.filename._M_dataplus._M_p != &local_c0.filename.field_2) {
    operator_delete(local_c0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  uVar5 = 0xffffffff;
  do {
    iVar3 = rounded_rectangle::vertex(&local_74,&local_e4,&rStack_e8);
    uVar5 = uVar5 + 1;
  } while (iVar3 == 2);
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_c0,&local_e0,0xb0);
  if (uVar5 < 0xb) {
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Value is not \'true\'!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar4,&local_98,&local_c0);
    __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  paVar2 = &local_c0.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_c0,&local_e0,0xb1);
  if (iVar3 != 0x30) {
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar4,&local_98,&local_c0);
    __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  iVar3 = rounded_rectangle::vertex(&local_74,&local_e4,&rStack_e8);
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_c0,&local_e0,0xb2);
  if (iVar3 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    iVar3 = rounded_rectangle::vertex(&local_74,&local_e4,&rStack_e8);
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo(&local_c0,&local_e0,0xb3);
    if (iVar3 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.filename._M_dataplus._M_p != paVar2) {
        operator_delete(local_c0.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      return;
    }
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar4,&local_98,&local_c0);
    __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Values are not equal!","");
  ut::FailedAssertion::FailedAssertion(pFVar4,&local_98,&local_c0);
  __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( AllowsIteration )
			{
				// INIT
				real_t x, y;

				// INIT / ACT
				rounded_rectangle r(10.0f, 20.0f, 30.0f, 40.0f, 5.0f);

				// ACT / ASSERT
				int n = 0;
				int cmd;

				assert_equal(path_command_move_to, r.vertex(&x, &y));

				for (; path_command_line_to == (cmd = r.vertex(&x, &y)); ++n)
				{	}
				
				assert_is_true(n >= 11);
				assert_equal(path_command_end_poly | path_flag_close, cmd);
				assert_equal(path_command_stop, r.vertex(&x, &y));
				assert_equal(path_command_stop, r.vertex(&x, &y));
			}